

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZDICT_tryMerge(dictItem *table,dictItem elt,U32 eltNbToSkip,void *buffer)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  U64 UVar4;
  U64 UVar5;
  uint in_ECX;
  uint in_EDX;
  ulong in_RSI;
  uint *in_RDI;
  long in_R8;
  bool bVar6;
  size_t addedLength_2;
  int addedLength_1;
  U32 addedLength;
  U32 u;
  char *buf;
  U32 eltEnd;
  U32 tableSize;
  uint local_78;
  int local_74;
  uint local_4c;
  uint local_10;
  uint uStack_c;
  
  uVar1 = *in_RDI;
  local_10 = (uint)in_RSI;
  uStack_c = (uint)(in_RSI >> 0x20);
  for (local_4c = 1; local_4c < uVar1; local_4c = local_4c + 1) {
    if (((local_4c != in_ECX) && (local_10 < in_RDI[(ulong)local_4c * 3])) &&
       (in_RDI[(ulong)local_4c * 3] <= local_10 + uStack_c)) {
      uVar1 = in_RDI[(ulong)local_4c * 3];
      in_RDI[(ulong)local_4c * 3 + 1] = (uVar1 - local_10) + in_RDI[(ulong)local_4c * 3 + 1];
      in_RDI[(ulong)local_4c * 3] = local_10;
      in_RDI[(ulong)local_4c * 3 + 2] =
           (in_EDX * (uVar1 - local_10)) / uStack_c + in_RDI[(ulong)local_4c * 3 + 2];
      in_RDI[(ulong)local_4c * 3 + 2] = (uStack_c >> 3) + in_RDI[(ulong)local_4c * 3 + 2];
      uVar2 = *(undefined8 *)(in_RDI + (ulong)local_4c * 3);
      uVar1 = (in_RDI + (ulong)local_4c * 3)[2];
      while( true ) {
        bVar6 = false;
        if (1 < local_4c) {
          bVar6 = in_RDI[(ulong)(local_4c - 1) * 3 + 2] < uVar1;
        }
        if (!bVar6) break;
        *(undefined8 *)(in_RDI + (ulong)local_4c * 3) =
             *(undefined8 *)(in_RDI + (ulong)(local_4c - 1) * 3);
        (in_RDI + (ulong)local_4c * 3)[2] = (in_RDI + (ulong)(local_4c - 1) * 3)[2];
        local_4c = local_4c - 1;
      }
      *(undefined8 *)(in_RDI + (ulong)local_4c * 3) = uVar2;
      (in_RDI + (ulong)local_4c * 3)[2] = uVar1;
      return local_4c;
    }
  }
  local_4c = 1;
  do {
    if (uVar1 <= local_4c) {
      return 0;
    }
    if (local_4c != in_ECX) {
      if ((local_10 <= in_RDI[(ulong)local_4c * 3] + in_RDI[(ulong)local_4c * 3 + 1]) &&
         (in_RDI[(ulong)local_4c * 3] < local_10)) {
        iVar3 = (local_10 + uStack_c) -
                (in_RDI[(ulong)local_4c * 3] + in_RDI[(ulong)local_4c * 3 + 1]);
        in_RDI[(ulong)local_4c * 3 + 2] = (uStack_c >> 3) + in_RDI[(ulong)local_4c * 3 + 2];
        if (0 < iVar3) {
          in_RDI[(ulong)local_4c * 3 + 1] = iVar3 + in_RDI[(ulong)local_4c * 3 + 1];
          in_RDI[(ulong)local_4c * 3 + 2] =
               (in_EDX * iVar3) / uStack_c + in_RDI[(ulong)local_4c * 3 + 2];
        }
        uVar2 = *(undefined8 *)(in_RDI + (ulong)local_4c * 3);
        uVar1 = (in_RDI + (ulong)local_4c * 3)[2];
        while( true ) {
          bVar6 = false;
          if (1 < local_4c) {
            bVar6 = in_RDI[(ulong)(local_4c - 1) * 3 + 2] < uVar1;
          }
          if (!bVar6) break;
          *(undefined8 *)(in_RDI + (ulong)local_4c * 3) =
               *(undefined8 *)(in_RDI + (ulong)(local_4c - 1) * 3);
          (in_RDI + (ulong)local_4c * 3)[2] = (in_RDI + (ulong)(local_4c - 1) * 3)[2];
          local_4c = local_4c - 1;
        }
        *(undefined8 *)(in_RDI + (ulong)local_4c * 3) = uVar2;
        (in_RDI + (ulong)local_4c * 3)[2] = uVar1;
        return local_4c;
      }
      UVar4 = MEM_read64((void *)(in_R8 + (ulong)in_RDI[(ulong)local_4c * 3]));
      UVar5 = MEM_read64((void *)(in_R8 + (in_RSI & 0xffffffff) + 1));
      if ((UVar4 == UVar5) &&
         (iVar3 = isIncluded((void *)(in_R8 + (ulong)in_RDI[(ulong)local_4c * 3]),
                             (void *)(in_R8 + (in_RSI & 0xffffffff) + 1),
                             (ulong)in_RDI[(ulong)local_4c * 3 + 1]), iVar3 != 0)) {
        if ((int)(uStack_c - in_RDI[(ulong)local_4c * 3 + 1]) < 2) {
          local_74 = 1;
        }
        else {
          local_74 = uStack_c - in_RDI[(ulong)local_4c * 3 + 1];
        }
        in_RDI[(ulong)local_4c * 3] = local_10;
        in_RDI[(ulong)local_4c * 3 + 2] =
             (int)(((ulong)in_EDX * (long)local_74) / (ulong)uStack_c) +
             in_RDI[(ulong)local_4c * 3 + 2];
        if (uStack_c < in_RDI[(ulong)local_4c * 3 + 1] + 1) {
          local_78 = uStack_c;
        }
        else {
          local_78 = in_RDI[(ulong)local_4c * 3 + 1] + 1;
        }
        in_RDI[(ulong)local_4c * 3 + 1] = local_78;
        return local_4c;
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

static U32 ZDICT_tryMerge(dictItem* table, dictItem elt, U32 eltNbToSkip, const void* buffer)
{
    const U32 tableSize = table->pos;
    const U32 eltEnd = elt.pos + elt.length;
    const char* const buf = (const char*) buffer;

    /* tail overlap */
    U32 u; for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;
        if ((table[u].pos > elt.pos) && (table[u].pos <= eltEnd)) {  /* overlap, existing > new */
            /* append */
            U32 const addedLength = table[u].pos - elt.pos;
            table[u].length += addedLength;
            table[u].pos = elt.pos;
            table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            elt = table[u];
            /* sort : improve rank */
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
    }   }

    /* front overlap */
    for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;

        if ((table[u].pos + table[u].length >= elt.pos) && (table[u].pos < elt.pos)) {  /* overlap, existing < new */
            /* append */
            int const addedLength = (int)eltEnd - (int)(table[u].pos + table[u].length);
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            if (addedLength > 0) {   /* otherwise, elt fully included into existing */
                table[u].length += addedLength;
                table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            }
            /* sort : improve rank */
            elt = table[u];
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
        }

        if (MEM_read64(buf + table[u].pos) == MEM_read64(buf + elt.pos + 1)) {
            if (isIncluded(buf + table[u].pos, buf + elt.pos + 1, table[u].length)) {
                size_t const addedLength = MAX( (int)elt.length - (int)table[u].length , 1 );
                table[u].pos = elt.pos;
                table[u].savings += (U32)(elt.savings * addedLength / elt.length);
                table[u].length = MIN(elt.length, table[u].length + 1);
                return u;
            }
        }
    }

    return 0;
}